

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O0

int __thiscall
ModelWriter::fwrite_weight_tag_data(ModelWriter *this,Mat *data,FILE *bp,float a,float b)

{
  long lVar1;
  FILE *in_RDX;
  Mat *in_RDI;
  uchar padding [4];
  size_t nalign;
  int nwrite;
  int tag_3;
  int tag_2;
  int tag_1;
  Mat data_flattened_fp16;
  int tag;
  Mat data_flattened;
  int p0;
  Option *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe20;
  Mat *in_stack_fffffffffffffe28;
  Option *in_stack_fffffffffffffe30;
  Mat *pMVar2;
  undefined4 local_1b4;
  size_t local_1b0;
  int local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c [5];
  Allocator *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  Mat *in_stack_fffffffffffffe88;
  Mat local_158;
  undefined4 local_110 [4];
  float *local_100;
  int *local_f8;
  ulong local_f0;
  long *local_e0;
  int local_d4;
  int local_b4;
  FILE *local_a8;
  Mat *local_90;
  Mat *local_88;
  float **local_78;
  float **local_68;
  int local_50;
  undefined4 local_4c;
  float **local_48;
  int local_30;
  undefined4 local_2c;
  Mat *local_28;
  
  local_a8 = in_RDX;
  lVar1 = ftell(in_RDX);
  local_b4 = (int)lVar1;
  ncnn::Mat::reshape(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe78);
  if (*(int *)&in_RDI[1].allocator != 0) {
    Randomize(in_stack_fffffffffffffe28,(float)((ulong)in_stack_fffffffffffffe20 >> 0x20),
              (float)in_stack_fffffffffffffe20);
  }
  if (local_f0 == 4) {
    if (*(int *)&in_RDI[1].field_0x1c == 1) {
      local_110[0] = 0x1306b47;
      fwrite(local_110,4,1,local_a8);
      pMVar2 = &local_158;
      local_158.data = (void *)0x0;
      local_158.refcount = (int *)0x0;
      local_158.elemsize = 0;
      local_158.elempack = 0;
      local_158.allocator = (Allocator *)0x0;
      local_158.dims = 0;
      local_158.w = 0;
      local_158.h = 0;
      local_158.d = 0;
      local_158.c = 0;
      local_158.cstep = 0;
      local_90 = pMVar2;
      ncnn::Option::Option(in_stack_fffffffffffffe00);
      ncnn::cast_float32_to_float16(in_RDI,pMVar2,in_stack_fffffffffffffe30);
      fwrite(local_158.data,local_158.elemsize,(long)local_158.w,local_a8);
      pMVar2 = &local_158;
      local_88 = pMVar2;
      local_28 = pMVar2;
      if (local_158.refcount != (int *)0x0) {
        local_2c = 0xffffffff;
        LOCK();
        local_30 = *local_158.refcount;
        *local_158.refcount = *local_158.refcount + -1;
        UNLOCK();
        if (local_30 == 1) {
          if (local_158.allocator == (Allocator *)0x0) {
            if (local_158.data != (void *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])(local_158.allocator,local_158.data);
          }
        }
      }
      pMVar2->data = (void *)0x0;
      pMVar2->elemsize = 0;
      pMVar2->elempack = 0;
      pMVar2->dims = 0;
      pMVar2->w = 0;
      pMVar2->h = 0;
      pMVar2->d = 0;
      pMVar2->c = 0;
      pMVar2->cstep = 0;
      pMVar2->refcount = (int *)0x0;
    }
    else {
      local_19c[0] = 0;
      fwrite(local_19c,4,1,local_a8);
      local_68 = &local_100;
      replace_denormals_with_zero(local_100,(long)local_d4);
      fwrite(local_100,local_f0,(long)local_d4,local_a8);
    }
  }
  else if (local_f0 == 2) {
    local_1a0 = 0x1306b47;
    fwrite(&local_1a0,4,1,local_a8);
    fwrite(local_100,local_f0,(long)local_d4,local_a8);
  }
  else if (local_f0 == 1) {
    local_1a4 = 0xd4b38;
    fwrite(&local_1a4,4,1,local_a8);
    fwrite(local_100,local_f0,(long)local_d4,local_a8);
  }
  else {
    fprintf(_stderr,"unknown weight data type %d\n",local_f0 & 0xffffffff);
  }
  lVar1 = ftell(local_a8);
  local_1a8 = (int)lVar1 - local_b4;
  local_1b0 = alignSize((long)local_1a8,4);
  local_1b4 = 0;
  fwrite(&local_1b4,1,local_1b0 - (long)local_1a8,local_a8);
  local_78 = &local_100;
  if (local_f8 != (int *)0x0) {
    local_4c = 0xffffffff;
    LOCK();
    local_50 = *local_f8;
    *local_f8 = *local_f8 + -1;
    UNLOCK();
    if (local_50 == 1) {
      local_48 = local_78;
      if (local_e0 == (long *)0x0) {
        if (local_100 != (float *)0x0) {
          free(local_100);
        }
      }
      else {
        (**(code **)(*local_e0 + 0x18))(local_e0,local_100);
      }
    }
  }
  return 0;
}

Assistant:

int ModelWriter::fwrite_weight_tag_data(const ncnn::Mat& data, FILE* bp, float a, float b)
{
    int p0 = ftell(bp);

    ncnn::Mat data_flattened = data.reshape(data.w * data.h * data.d * data.c);
    if (gen_random_weight)
        Randomize(data_flattened, a, b);

    if (data_flattened.elemsize == 4)
    {
        if (storage_type == 1)
        {
            const int tag = 0x01306B47; // fp16 magic
            fwrite(&tag, sizeof(int), 1, bp);
            ncnn::Mat data_flattened_fp16;
            ncnn::cast_float32_to_float16(data_flattened, data_flattened_fp16);
            fwrite(data_flattened_fp16.data, data_flattened_fp16.elemsize, data_flattened_fp16.w, bp);
        }
        else
        {
            const int tag = 0; // fp32 magic
            fwrite(&tag, sizeof(int), 1, bp);
            replace_denormals_with_zero(data_flattened, data_flattened.w);
            fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
        }
    }
    else if (data_flattened.elemsize == 2)
    {
        const int tag = 0x01306B47; // fp16 magic
        fwrite(&tag, sizeof(int), 1, bp);
        fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
    }
    else if (data_flattened.elemsize == 1)
    {
        const int tag = 0x000D4B38; // int8 magic
        fwrite(&tag, sizeof(int), 1, bp);
        fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
    }
    else
    {
        fprintf(stderr, "unknown weight data type %d\n", (int)data_flattened.elemsize);
    }

    // padding to 32bit align
    int nwrite = ftell(bp) - p0;
    size_t nalign = alignSize(nwrite, 4);
    unsigned char padding[4] = {0x00, 0x00, 0x00, 0x00};
    fwrite(padding, sizeof(unsigned char), nalign - nwrite, bp);

    return 0;
}